

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O0

int EmitRescaledAlphaRGB(VP8Io *io,WebPDecParams *p,int expected_num_out_lines)

{
  int iVar1;
  int iVar2;
  int in_EDX;
  WebPRescaler *in_RSI;
  long in_RDI;
  int64_t row_offset;
  int y_end;
  int lines_left;
  WebPRescaler *scaler;
  uint8_t *src;
  int num_lines;
  
  if (*(long *)(in_RDI + 0x98) != 0) {
    src = in_RSI->dst;
    iVar1 = in_RSI->y_sub + in_EDX;
    num_lines = in_EDX;
    for (; 0 < in_EDX; in_EDX = in_EDX - iVar2) {
      WebPRescalerImport(in_RSI,num_lines,src,in_EDX);
      iVar2 = (**(code **)(in_RSI + 1))(in_RSI,iVar1 - in_EDX,in_EDX);
    }
  }
  return 0;
}

Assistant:

static int EmitRescaledAlphaRGB(const VP8Io* const io, WebPDecParams* const p,
                                int expected_num_out_lines) {
  if (io->a != NULL) {
    WebPRescaler* const scaler = p->scaler_a;
    int lines_left = expected_num_out_lines;
    const int y_end = p->last_y + lines_left;
    while (lines_left > 0) {
      const int64_t row_offset = (int64_t)scaler->src_y - io->mb_y;
      WebPRescalerImport(scaler, io->mb_h + io->mb_y - scaler->src_y,
                         io->a + row_offset * io->width, io->width);
      lines_left -= p->emit_alpha_row(p, y_end - lines_left, lines_left);
    }
  }
  return 0;
}